

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

Result tonk::SecureRandom_Initialize(void)

{
  int iVar1;
  char *pcVar2;
  ErrorResult *in_RDI;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)PrngLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (PrngInitialized == '\x01') {
LAB_00132793:
    in_RDI->Source = (char *)0x0;
  }
  else {
    iVar1 = cymric_init_(4);
    if (iVar1 == 0) {
      iVar1 = cymric_seed((cymric_rng *)Prng,(void *)0x0,0);
      if (iVar1 == 0) {
        PrngInitialized = '\x01';
        goto LAB_00132793;
      }
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cymric_seed failed","");
      pcVar2 = (char *)operator_new(0x38);
      *(char **)pcVar2 = "SecureRandom_Initialize";
      *(char **)(pcVar2 + 8) = pcVar2 + 0x18;
      std::__cxx11::string::_M_construct<char*>((string *)(pcVar2 + 8),local_40,local_40 + local_38)
      ;
    }
    else {
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cymric_init failed","");
      pcVar2 = (char *)operator_new(0x38);
      *(char **)pcVar2 = "tonk_init";
      *(char **)(pcVar2 + 8) = pcVar2 + 0x18;
      std::__cxx11::string::_M_construct<char*>((string *)(pcVar2 + 8),local_40,local_40 + local_38)
      ;
    }
    pcVar2[0x28] = '\x03';
    pcVar2[0x29] = '\0';
    pcVar2[0x2a] = '\0';
    pcVar2[0x2b] = '\0';
    in_RDI->Source = pcVar2;
    *(long *)(pcVar2 + 0x30) = (long)iVar1;
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)PrngLock);
  return (Result)in_RDI;
}

Assistant:

Result SecureRandom_Initialize()
{
    Locker locker(PrngLock);
    if (PrngInitialized)
        return Result::Success();

    int cymricResult = cymric_init();
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("tonk_init", "cymric_init failed", ErrorType::Cymric, cymricResult);
    }

    cymricResult = cymric_seed(&Prng, nullptr, 0);
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Initialize", "cymric_seed failed", ErrorType::Cymric, cymricResult);
    }

    PrngInitialized = true;
    return Result::Success();
}